

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_setup_conn(connectdata *conn,_Bool *protocol_done)

{
  SessionHandle *data_00;
  char *pcVar1;
  timeval tVar2;
  __time_t local_50;
  __suseconds_t local_48;
  __time_t local_40;
  __suseconds_t local_38;
  SessionHandle *data;
  CURLcode result;
  _Bool *protocol_done_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  Curl_pgrsTime(data_00,TIMER_NAMELOOKUP);
  if ((conn->handler->flags & 0x10) == 0) {
    *protocol_done = false;
    (conn->bits).proxy_connect_closed = false;
    if ((data_00->set).str[0x19] != (char *)0x0) {
      if ((conn->allocptr).uagent != (char *)0x0) {
        (*Curl_cfree)((conn->allocptr).uagent);
        (conn->allocptr).uagent = (char *)0x0;
      }
      pcVar1 = curl_maprintf("User-Agent: %s\r\n",(data_00->set).str[0x19]);
      (conn->allocptr).uagent = pcVar1;
      if ((conn->allocptr).uagent == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data_00->req).headerbytecount = 0;
    (data_00->state).crlf_conversions = 0;
    tVar2 = curlx_tvnow();
    local_40 = tVar2.tv_sec;
    (conn->now).tv_sec = local_40;
    local_38 = tVar2.tv_usec;
    (conn->now).tv_usec = local_38;
    if (conn->sock[0] == -1) {
      (conn->bits).tcpconnect[0] = false;
      data._4_4_ = Curl_connecthost(conn,conn->dns_entry);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
    }
    else {
      Curl_pgrsTime(data_00,TIMER_CONNECT);
      Curl_pgrsTime(data_00,TIMER_APPCONNECT);
      (conn->bits).tcpconnect[0] = true;
      *protocol_done = true;
      Curl_updateconninfo(conn,conn->sock[0]);
      Curl_verboseconnect(conn);
    }
    tVar2 = curlx_tvnow();
    local_50 = tVar2.tv_sec;
    (conn->now).tv_sec = local_50;
    local_48 = tVar2.tv_usec;
    (conn->now).tv_usec = local_48;
    conn_local._4_4_ = data._4_4_;
  }
  else {
    *protocol_done = true;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_setup_conn(struct connectdata *conn,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }
  *protocol_done = FALSE; /* default to not done */

  /* set proxy_connect_closed to false unconditionally already here since it
     is used strictly to provide extra information to a parent function in the
     case of proxy CONNECT failures and we must make sure we don't have it
     lingering set from a previous invoke */
  conn->bits.proxy_connect_closed = FALSE;

  /*
   * Set user-agent. Used for HTTP, but since we can attempt to tunnel
   * basically anything through a http proxy we can't limit this based on
   * protocol.
   */
  if(data->set.str[STRING_USERAGENT]) {
    Curl_safefree(conn->allocptr.uagent);
    conn->allocptr.uagent =
      aprintf("User-Agent: %s\r\n", data->set.str[STRING_USERAGENT]);
    if(!conn->allocptr.uagent)
      return CURLE_OUT_OF_MEMORY;
  }

  data->req.headerbytecount = 0;

#ifdef CURL_DO_LINEEND_CONV
  data->state.crlf_conversions = 0; /* reset CRLF conversion counter */
#endif /* CURL_DO_LINEEND_CONV */

  /* set start time here for timeout purposes in the connect procedure, it
     is later set again for the progress meter purpose */
  conn->now = Curl_tvnow();

  if(CURL_SOCKET_BAD == conn->sock[FIRSTSOCKET]) {
    conn->bits.tcpconnect[FIRSTSOCKET] = FALSE;
    result = Curl_connecthost(conn, conn->dns_entry);
    if(result)
      return result;
  }
  else {
    Curl_pgrsTime(data, TIMER_CONNECT);    /* we're connected already */
    Curl_pgrsTime(data, TIMER_APPCONNECT); /* we're connected already */
    conn->bits.tcpconnect[FIRSTSOCKET] = TRUE;
    *protocol_done = TRUE;
    Curl_updateconninfo(conn, conn->sock[FIRSTSOCKET]);
    Curl_verboseconnect(conn);
  }

  conn->now = Curl_tvnow(); /* time this *after* the connect is done, we
                               set this here perhaps a second time */

#ifdef __EMX__
  /*
   * This check is quite a hack. We're calling _fsetmode to fix the problem
   * with fwrite converting newline characters (you get mangled text files,
   * and corrupted binary files when you download to stdout and redirect it to
   * a file).
   */

  if((data->set.out)->_handle == NULL) {
    _fsetmode(stdout, "b");
  }
#endif

  return result;
}